

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

native_path_string *
libtorrent::convert_to_native_path_string(native_path_string *__return_storage_ptr__,string *path)

{
  string *path_local;
  
  convert_to_native(__return_storage_ptr__,path);
  return __return_storage_ptr__;
}

Assistant:

native_path_string convert_to_native_path_string(std::string const& path)
	{
#if TORRENT_USE_UNC_PATHS
		// UNC paths must be absolute
		// network paths are already UNC paths
		std::string prepared_path = complete(path);
		if (prepared_path.substr(0,2) != "\\\\")
			prepared_path = "\\\\?\\" + prepared_path;
		std::replace(prepared_path.begin(), prepared_path.end(), '/', '\\');

		return convert_to_wstring(prepared_path);
#else // TORRENT_WINDOWS
		return convert_to_native(path);
#endif
	}